

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O2

ssize_t gzip_filter_read(archive_read_filter *self,void **p)

{
  z_streamp strm;
  z_streamp pzVar1;
  uInt uVar2;
  uint uVar3;
  int iVar4;
  ssize_t request;
  uLong uVar5;
  Bytef *pBVar6;
  void *pvVar7;
  long lVar8;
  char *fmt;
  archive_read_filter *filter;
  archive_read *a;
  ssize_t avail_in;
  uInt local_40;
  undefined4 uStack_3c;
  void **local_38;
  
  strm = (z_streamp)self->data;
  strm->next_out = *(Bytef **)&strm[1].avail_in;
  uVar2 = (uInt)strm[1].total_in;
  strm->avail_out = uVar2;
  local_38 = p;
  while( true ) {
    if ((uVar2 == 0) || ((char)strm[1].total_out != '\0')) goto LAB_003e0f81;
    if (*(char *)&strm[1].next_in == '\0') break;
LAB_003e0eac:
    pBVar6 = (Bytef *)__archive_read_filter_ahead(self->upstream,1,&avail_in);
    strm->next_in = pBVar6;
    if (pBVar6 == (Bytef *)0x0) {
      a = self->archive;
      fmt = "truncated gzip input";
      goto LAB_003e0fd5;
    }
    strm->avail_in = (uInt)avail_in;
    iVar4 = cm_zlib_inflate(strm,0);
    if (iVar4 == 1) {
      __archive_read_filter_consume
                (self->upstream,CONCAT44(avail_in._4_4_,(uInt)avail_in) - (ulong)strm->avail_in);
      pzVar1 = (z_streamp)self->data;
      *(undefined1 *)&pzVar1[1].next_in = 0;
      iVar4 = cm_zlib_inflateEnd(pzVar1);
      if (iVar4 != 0) {
        a = self->archive;
        fmt = "Failed to clean up gzip decompressor";
        goto LAB_003e0fd5;
      }
      pvVar7 = __archive_read_filter_ahead(self->upstream,8,(ssize_t *)&local_40);
      if (pvVar7 == (void *)0x0) {
        return -0x1e;
      }
      if (CONCAT44(uStack_3c,local_40) == 0) {
        return -0x1e;
      }
      filter = self->upstream;
      lVar8 = 8;
    }
    else {
      if (iVar4 != 0) {
        a = self->archive;
        fmt = "gzip decompression failed";
        goto LAB_003e0fd5;
      }
      filter = self->upstream;
      lVar8 = CONCAT44(avail_in._4_4_,(uInt)avail_in) - (ulong)strm->avail_in;
    }
    __archive_read_filter_consume(filter,lVar8);
    uVar2 = strm->avail_out;
  }
  pzVar1 = (z_streamp)self->data;
  request = peek_at_header(self->upstream,(int *)0x0);
  if (request != 0) {
    __archive_read_filter_consume(self->upstream,request);
    uVar5 = cm_zlib_crc32(0,(uchar *)0x0,0);
    *(uLong *)&pzVar1[1].avail_out = uVar5;
    pBVar6 = (Bytef *)__archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_40);
    pzVar1->next_in = pBVar6;
    pzVar1->avail_in = local_40;
    uVar3 = cm_zlib_inflateInit2_(pzVar1,-0xf,"1.2.3",0x70);
    switch(uVar3) {
    case 0:
      *(undefined1 *)&pzVar1[1].next_in = 1;
      goto LAB_003e0eac;
    case 0xfffffffa:
      a = self->archive;
      fmt = "Internal error initializing compression library: invalid library version";
      break;
    default:
      archive_set_error(&self->archive->archive,-1,
                        "Internal error initializing compression library:  Zlib error %d",
                        (ulong)uVar3);
      return -0x1e;
    case 0xfffffffc:
      a = self->archive;
      fmt = "Internal error initializing compression library: out of memory";
      iVar4 = 0xc;
      goto LAB_003e0fd7;
    case 0xfffffffe:
      a = self->archive;
      fmt = "Internal error initializing compression library: invalid setup parameter";
    }
LAB_003e0fd5:
    iVar4 = -1;
LAB_003e0fd7:
    archive_set_error(&a->archive,iVar4,fmt);
    return -0x1e;
  }
  *(undefined1 *)&strm[1].total_out = 1;
LAB_003e0f81:
  pvVar7 = *(void **)&strm[1].avail_in;
  lVar8 = (long)strm->next_out - (long)pvVar7;
  strm[1].next_out = strm[1].next_out + lVar8;
  if (lVar8 == 0) {
    pvVar7 = (void *)0x0;
  }
  *local_38 = pvVar7;
  return lVar8;
}

Assistant:

static ssize_t
gzip_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in;
	int ret;

	state = (struct private_data *)self->data;

	/* Empty our output buffer. */
	state->stream.next_out = state->out_block;
	state->stream.avail_out = (uInt)state->out_block_size;

	/* Try to fill the output buffer. */
	while (state->stream.avail_out > 0 && !state->eof) {
		/* If we're not in a stream, read a header
		 * and initialize the decompression library. */
		if (!state->in_stream) {
			ret = consume_header(self);
			if (ret == ARCHIVE_EOF) {
				state->eof = 1;
				break;
			}
			if (ret < ARCHIVE_OK)
				return (ret);
		}

		/* Peek at the next available data. */
		/* ZLib treats stream.next_in as const but doesn't declare
		 * it so, hence this ugly cast. */
		state->stream.next_in = (unsigned char *)(uintptr_t)
		    __archive_read_filter_ahead(self->upstream, 1, &avail_in);
		if (state->stream.next_in == NULL) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "truncated gzip input");
			return (ARCHIVE_FATAL);
		}
		state->stream.avail_in = (uInt)avail_in;

		/* Decompress and consume some of that data. */
		ret = inflate(&(state->stream), 0);
		switch (ret) {
		case Z_OK: /* Decompressor made some progress. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			break;
		case Z_STREAM_END: /* Found end of stream. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			/* Consume the stream trailer; release the
			 * decompression library. */
			ret = consume_trailer(self);
			if (ret < ARCHIVE_OK)
				return (ret);
			break;
		default:
			/* Return an error. */
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "gzip decompression failed");
			return (ARCHIVE_FATAL);
		}
	}

	/* We've read as much as we can. */
	decompressed = state->stream.next_out - state->out_block;
	state->total_out += decompressed;
	if (decompressed == 0)
		*p = NULL;
	else
		*p = state->out_block;
	return (decompressed);
}